

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLURL.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::XMLURL::conglomerateWithBase(XMLURL *this,XMLURL *baseURL,bool useExceptions)

{
  bool bVar1;
  MalformedURLException *this_00;
  XMLCh *pXVar2;
  XMLCh *temp;
  bool hadPath;
  bool useExceptions_local;
  XMLURL *baseURL_local;
  XMLURL *this_local;
  
  bVar1 = isRelative(baseURL);
  if (bVar1) {
    if (useExceptions) {
      this_00 = (MalformedURLException *)__cxa_allocate_exception(0x30);
      MalformedURLException::MalformedURLException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLURL.cpp"
                 ,0x340,URL_RelativeBaseURL,this->fMemoryManager);
      __cxa_throw(this_00,&MalformedURLException::typeinfo,
                  MalformedURLException::~MalformedURLException);
    }
    this_local._7_1_ = false;
  }
  else if ((((this->fProtocol == Unknown) && (this->fHost == (XMLCh *)0x0)) &&
           (this->fPath == (XMLCh *)0x0)) && (this->fFragment != (XMLCh *)0x0)) {
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fUser);
    this->fUser = (XMLCh *)0x0;
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPassword);
    this->fPassword = (XMLCh *)0x0;
    this->fProtocol = baseURL->fProtocol;
    this->fPortNum = baseURL->fPortNum;
    pXVar2 = XMLString::replicate(baseURL->fHost,this->fMemoryManager);
    this->fHost = pXVar2;
    pXVar2 = XMLString::replicate(baseURL->fUser,this->fMemoryManager);
    this->fUser = pXVar2;
    pXVar2 = XMLString::replicate(baseURL->fPassword,this->fMemoryManager);
    this->fPassword = pXVar2;
    pXVar2 = XMLString::replicate(baseURL->fPath,this->fMemoryManager);
    this->fPath = pXVar2;
    this_local._7_1_ = true;
  }
  else if (this->fProtocol == Unknown) {
    this->fProtocol = baseURL->fProtocol;
    if ((this->fProtocol == File) ||
       ((this->fHost == (XMLCh *)0x0 && (baseURL->fHost != (XMLCh *)0x0)))) {
      if (baseURL->fHost != (XMLCh *)0x0) {
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fUser);
        this->fUser = (XMLCh *)0x0;
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPassword);
        this->fPassword = (XMLCh *)0x0;
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fHost);
        this->fHost = (XMLCh *)0x0;
        pXVar2 = XMLString::replicate(baseURL->fHost,this->fMemoryManager);
        this->fHost = pXVar2;
        pXVar2 = XMLString::replicate(baseURL->fUser,this->fMemoryManager);
        this->fUser = pXVar2;
        pXVar2 = XMLString::replicate(baseURL->fPassword,this->fMemoryManager);
        this->fPassword = pXVar2;
        this->fPortNum = baseURL->fPortNum;
      }
      bVar1 = this->fPath == (XMLCh *)0x0;
      if ((bVar1) || (*this->fPath != L'/')) {
        if (baseURL->fPath != (XMLCh *)0x0) {
          pXVar2 = XMLPlatformUtils::weavePaths(baseURL->fPath,this->fPath,this->fMemoryManager);
          (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPath);
          this->fPath = pXVar2;
        }
        if (bVar1) {
          if ((this->fQuery == (XMLCh *)0x0) && (baseURL->fQuery != (XMLCh *)0x0)) {
            pXVar2 = XMLString::replicate(baseURL->fQuery,this->fMemoryManager);
            this->fQuery = pXVar2;
            if ((this->fFragment == (XMLCh *)0x0) && (baseURL->fFragment != (XMLCh *)0x0)) {
              pXVar2 = XMLString::replicate(baseURL->fFragment,this->fMemoryManager);
              this->fFragment = pXVar2;
              this_local._7_1_ = true;
            }
            else {
              this_local._7_1_ = true;
            }
          }
          else {
            this_local._7_1_ = true;
          }
        }
        else {
          this_local._7_1_ = true;
        }
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool XMLURL::conglomerateWithBase(const XMLURL& baseURL, bool useExceptions)
{
    // The base URL cannot be relative
    if (baseURL.isRelative())
    {
        if (useExceptions)
			ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_RelativeBaseURL, fMemoryManager);
        else
            return false;
    }

    //
    //  Check a special case. If all we have is a fragment, then we want
    //  to just take the base host and path, plus our fragment.
    //
    if ((fProtocol == Unknown)
    &&  !fHost
    &&  !fPath
    &&  fFragment)
    {
        // Just in case, make sure we don't leak the user or password values
        fMemoryManager->deallocate(fUser);//delete [] fUser;
        fUser = 0;
        fMemoryManager->deallocate(fPassword);//delete [] fPassword;
        fPassword = 0;

        // Copy over the protocol and port number as is
        fProtocol = baseURL.fProtocol;
        fPortNum = baseURL.fPortNum;

        // Replicate the base fields that are provided
        fHost = XMLString::replicate(baseURL.fHost, fMemoryManager);
        fUser = XMLString::replicate(baseURL.fUser, fMemoryManager);
        fPassword = XMLString::replicate(baseURL.fPassword, fMemoryManager);
        fPath = XMLString::replicate(baseURL.fPath, fMemoryManager);
        return true;
    }

    //
    //  All we have to do is run up through our fields and, for each one
    //  that we don't have, use the based URL's. Once we hit one field
    //  that we have, we stop.
    //
    if (fProtocol != Unknown)
        return true;
    fProtocol = baseURL.fProtocol;

    //
    //  If the protocol is not file, and we either already have our own
    //  host, or the base does not have one, then we are done.
    //
    if (fProtocol != File)
    {
        if (fHost || !baseURL.fHost)
            return true;
    }

    // Replicate all of the hosty stuff if the base has one
    if (baseURL.fHost)
    {
        // Just in case, make sure we don't leak a user or password field
        fMemoryManager->deallocate(fUser);//delete [] fUser;
        fUser = 0;
        fMemoryManager->deallocate(fPassword);//delete [] fPassword;
        fPassword = 0;
        fMemoryManager->deallocate(fHost);//delete [] fHost;
        fHost = 0;

        fHost = XMLString::replicate(baseURL.fHost, fMemoryManager);
        fUser = XMLString::replicate(baseURL.fUser, fMemoryManager);
        fPassword = XMLString::replicate(baseURL.fPassword, fMemoryManager);

        fPortNum = baseURL.fPortNum;
    }

    // If we have a path and its absolute, then we are done
    const bool hadPath = (fPath != 0);
    if (hadPath)
    {
        if (*fPath == chForwardSlash)
            return true;
    }

    // Its a relative path, so weave them together.
    if (baseURL.fPath) {
        XMLCh* temp = XMLPlatformUtils::weavePaths(baseURL.fPath, fPath ,fMemoryManager);
        fMemoryManager->deallocate(fPath);//delete [] fPath;
        fPath = temp;
    }

    // If we had any original path, then we are done
    if (hadPath)
        return true;

    // We had no original path, so go on to deal with the query/fragment parts
    if (fQuery || !baseURL.fQuery)
        return true;
    fQuery = XMLString::replicate(baseURL.fQuery, fMemoryManager);

    if (fFragment || !baseURL.fFragment)
        return true;
    fFragment = XMLString::replicate(baseURL.fFragment, fMemoryManager);
	return true;
}